

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_19f832d::HandleSublistCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *this;
  bool bVar3;
  undefined8 uVar4;
  long lVar5;
  _Alloc_hider _Var6;
  string *name;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string_view value;
  int length;
  int start;
  cmList sublist;
  optional<cmList> list;
  int local_c8;
  int local_c4;
  string local_c0;
  string local_a0;
  string *local_80;
  cmAlphaNum *local_78;
  undefined8 local_70;
  char *local_68;
  undefined8 local_60;
  _Storage<cmList,_false> local_58;
  bool local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pbVar2 - (long)pbVar1;
  if (lVar5 != 0xa0) {
    local_a0._M_dataplus._M_p = (pointer)0x2d;
    local_a0._M_string_length = 0x93f46f;
    local_a0.field_2._M_allocated_capacity = 0;
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&local_58,(lVar5 >> 5) - 1);
    uVar4 = (cmAlphaNum *)((long)&local_58 + 0x10);
    if ((cmAlphaNum *)
        local_58._M_value.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (cmAlphaNum *)0x0) {
      uVar4 = local_58._M_value.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    }
    local_80 = ((cmAlphaNum *)uVar4)->RValueString_;
    uVar4 = (cmAlphaNum *)&local_58;
    if ((cmAlphaNum *)
        local_58._M_value.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (cmAlphaNum *)0x0) {
      uVar4 = local_58._M_value.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    }
    local_a0.field_2._8_8_ = (((cmAlphaNum *)uVar4)->View_)._M_len;
    local_78 = (cmAlphaNum *)
               local_58._M_value.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_70 = 8;
    local_68 = " found).";
    local_60 = 0;
    views._M_len = 3;
    views._M_array = (iterator)&local_a0;
    cmCatViews(&local_c0,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  name = pbVar2 + -1;
  GetList((optional<cmList> *)&local_58,pbVar1 + 1,status->Makefile);
  if ((local_40 != true) ||
     (local_58._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_58._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar3 = true;
    cmMakefile::AddDefinition(status->Makefile,name,(string_view)(ZEXT816(0x98e619) << 0x40));
    goto LAB_0048b395;
  }
  bVar3 = GetIndexArg((args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 2,&local_c4,status->Makefile);
  if (bVar3) {
    bVar3 = GetIndexArg((args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 3,&local_c8,status->Makefile);
    if (!bVar3) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_a0._M_dataplus._M_p = (char *)0x7;
      local_a0._M_string_length = 0x9177f9;
      local_a0.field_2._M_allocated_capacity = 0;
      local_80 = (string *)pbVar1[3]._M_dataplus._M_p;
      local_a0.field_2._8_8_ = pbVar1[3]._M_string_length;
      local_78 = (cmAlphaNum *)0x0;
      local_70 = 0x15;
      local_68 = " is not a valid index";
      local_60 = 0;
      views_01._M_len = 3;
      views_01._M_array = (iterator)&local_a0;
      cmCatViews(&local_c0,views_01);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0048b378;
    }
    if ((long)local_c4 < 0) {
      local_c0._M_dataplus._M_p =
           (pointer)(((long)local_58._M_value.Values.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - local_58._0_8_ >> 5) + -1);
      cmStrCat<char_const(&)[14],int&,char_const(&)[22],unsigned_long>
                (&local_a0,(char (*) [14])"begin index: ",&local_c4,
                 (char (*) [22])" is out of range 0 - ",(unsigned_long *)&local_c0);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      if (-2 < (long)local_c8) {
        cmList::sublist((cmList *)&local_c0,(cmList *)&local_58,(long)local_c4,(long)local_c8);
        this = status->Makefile;
        cmList::to_string_abi_cxx11_(&local_a0,(cmList *)&local_c0);
        value._M_str = local_a0._M_dataplus._M_p;
        value._M_len = local_a0._M_string_length;
        cmMakefile::AddDefinition(this,name,value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_c0);
        bVar3 = true;
        goto LAB_0048b395;
      }
      cmStrCat<char_const(&)[9],int&,char_const(&)[25]>
                (&local_a0,(char (*) [9])0x8f141a,&local_c8,
                 (char (*) [25])" should be -1 or greater");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    local_c0.field_2._M_allocated_capacity = local_a0.field_2._M_allocated_capacity;
    _Var6._M_p = local_a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) goto LAB_0048b38b;
  }
  else {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_a0._M_dataplus._M_p = (char *)0x7;
    local_a0._M_string_length = 0x9177f9;
    local_a0.field_2._M_allocated_capacity = 0;
    local_80 = (string *)pbVar1[2]._M_dataplus._M_p;
    local_a0.field_2._8_8_ = pbVar1[2]._M_string_length;
    local_78 = (cmAlphaNum *)0x0;
    local_70 = 0x15;
    local_68 = " is not a valid index";
    local_60 = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&local_a0;
    cmCatViews(&local_c0,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0048b378:
    _Var6._M_p = local_c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
LAB_0048b38b:
      operator_delete(_Var6._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = false;
LAB_0048b395:
  if (local_40 == true) {
    local_40 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
  }
  return bVar3;
}

Assistant:

bool HandleSublistCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() != 5) {
    status.SetError(cmStrCat("sub-command SUBLIST requires four arguments (",
                             args.size() - 1, " found)."));
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();

  // expand the variable
  auto list = GetList(listName, status.GetMakefile());

  if (!list || list->empty()) {
    status.GetMakefile().AddDefinition(variableName, "");
    return true;
  }

  int start;
  int length;
  if (!GetIndexArg(args[2], &start, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[2], " is not a valid index"));
    return false;
  }
  if (!GetIndexArg(args[3], &length, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[3], " is not a valid index"));
    return false;
  }

  if (start < 0) {
    status.SetError(cmStrCat("begin index: ", start, " is out of range 0 - ",
                             list->size() - 1));
    return false;
  }
  if (length < -1) {
    status.SetError(cmStrCat("length: ", length, " should be -1 or greater"));
    return false;
  }

  using size_type = cmList::size_type;

  try {
    auto sublist = list->sublist(static_cast<size_type>(start),
                                 static_cast<size_type>(length));
    status.GetMakefile().AddDefinition(variableName, sublist.to_string());
    return true;
  } catch (std::out_of_range& e) {
    status.SetError(e.what());
    return false;
  }
}